

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglxintegration.cpp
# Opt level: O0

Window createDummyWindow(Display *dpy,GLXFBConfig config,int screenNumber,Window rootWin)

{
  long lVar1;
  Window WVar2;
  undefined8 in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  Window window;
  XVisualInfo *visualInfo;
  char *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  int line;
  char *in_stack_ffffffffffffffa8;
  char local_28 [8];
  Window in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffec;
  XVisualInfo *in_stack_fffffffffffffff0;
  Display *dpy_00;
  
  line = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  dpy_00 = *(Display **)(in_FS_OFFSET + 0x28);
  lVar1 = glXGetVisualFromFBConfig(in_RDI,in_RSI);
  if (lVar1 == 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)0x0,in_stack_ffffffffffffffa8,line,in_stack_ffffffffffffff98);
    QMessageLogger::fatal(local_28,"Could not initialize GLX");
  }
  WVar2 = createDummyWindow(dpy_00,in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,
                            in_stack_ffffffffffffffe0);
  XFree(lVar1);
  if (*(Display **)(in_FS_OFFSET + 0x28) != dpy_00) {
    __stack_chk_fail();
  }
  return WVar2;
}

Assistant:

static Window createDummyWindow(Display *dpy, GLXFBConfig config, int screenNumber, Window rootWin)
{
    XVisualInfo *visualInfo = glXGetVisualFromFBConfig(dpy, config);
    if (Q_UNLIKELY(!visualInfo))
        qFatal("Could not initialize GLX");
    Window window = createDummyWindow(dpy, visualInfo, screenNumber, rootWin);
    XFree(visualInfo);
    return window;
}